

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O2

void __thiscall bssl::anon_unknown_0::SpanTest_MakeSpan_Test::TestBody(SpanTest_MakeSpan_Test *this)

{
  int *piVar1;
  size_t in_R8;
  initializer_list<int> __l;
  Span<int> s;
  Span<int> s_00;
  Span<const_int> s_01;
  Span<const_int> s_02;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> v;
  int local_14 [3];
  
  local_14[0] = 100;
  local_14[1] = 200;
  local_14[2] = 300;
  __l._M_len = 3;
  __l._M_array = local_14;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_31);
  piVar1 = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  s.size_ = (size_t)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
  s.data_ = piVar1;
  TestCtor((anon_unknown_0 *)
           v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
           s,piVar1,in_R8);
  piVar1 = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  s_00.size_ = (size_t)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
  s_00.data_ = piVar1;
  TestCtor((anon_unknown_0 *)
           v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
           s_00,piVar1,in_R8);
  piVar1 = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  s_01.size_ = (size_t)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
  s_01.data_ = piVar1;
  TestConstCtor((anon_unknown_0 *)
                v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start,s_01,piVar1,in_R8);
  piVar1 = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  s_02.size_ = (size_t)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
  s_02.data_ = piVar1;
  TestConstCtor((anon_unknown_0 *)
                v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start,s_02,piVar1,in_R8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(SpanTest, MakeSpan) {
  std::vector<int> v = {100, 200, 300};
  TestCtor(MakeSpan(v), v.data(), v.size());
  TestCtor(MakeSpan(v.data(), v.size()), v.data(), v.size());
  TestConstCtor(MakeSpan(v.data(), v.size()), v.data(), v.size());
  TestConstCtor(MakeSpan(v), v.data(), v.size());
}